

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::Generate
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  reference ppOVar5;
  OneofGeneratorInfo *pOVar6;
  mapped_type *pmVar7;
  FieldDescriptor *field;
  ImmutableFieldLiteGenerator *pIVar8;
  string *psVar9;
  int __c;
  Descriptor *descriptor;
  AlphaNum *a;
  int local_188;
  allocator local_181;
  int i;
  AlphaNum local_160;
  string local_130;
  allocator local_109;
  key_type local_108;
  allocator local_e1;
  key_type local_e0;
  OneofDescriptor *local_c0;
  OneofDescriptor *oneof;
  iterator __end3;
  iterator __begin3;
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_58;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderLiteGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  WriteMessageDocComment(printer,this->descriptor_);
  pPVar1 = local_18;
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_38,this->name_resolver_,this->descriptor_);
  ExtraBuilderInterfaces_abi_cxx11_(&local_58,(java *)this->descriptor_,descriptor);
  iVar3 = Descriptor::extension_range_count(this->descriptor_);
  pcVar4 = "";
  if (0 < iVar3) {
    pcVar4 = "Extendable";
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pcVar4;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[11],char_const*>
            (pPVar1,
             "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
             ,(char (*) [10])0x77c586,&local_38,(char (*) [17])"extra_interfaces",&local_58,
             (char (*) [11])"extendible",
             (char **)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(local_18);
  GenerateCommonBuilderMethods(this,local_18);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range3);
  __end3 = std::
           set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
           ::begin(&this->oneofs_);
  oneof = (OneofDescriptor *)
          std::
          set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
          ::end(&this->oneofs_);
  while( true ) {
    bVar2 = std::operator!=(&__end3,(_Self *)&oneof);
    if (!bVar2) break;
    ppOVar5 = std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator*
                        (&__end3);
    local_c0 = *ppOVar5;
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,local_c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"oneof_name",&local_e1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_e0);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)pOVar6);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,local_c0);
    psVar9 = &pOVar6->capitalized_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"oneof_capitalized_name",&local_109);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,&local_108);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)psVar9);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    pcVar4 = OneofDescriptor::index(local_c0,(char *)psVar9,__c);
    strings::AlphaNum::AlphaNum(&local_160,(int)pcVar4);
    StrCat_abi_cxx11_(&local_130,(protobuf *)&local_160,a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,"oneof_index",&local_181);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range3,(key_type *)&i);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_130);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    std::__cxx11::string::~string((string *)&local_130);
    io::Printer::Print(local_18,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&__range3,
                       "@java.lang.Override\npublic $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return instance.get$oneof_capitalized_name$Case();\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  copyOnWrite();\n  instance.clear$oneof_capitalized_name$();\n  return this;\n}\n\n"
                      );
    std::_Rb_tree_const_iterator<const_google::protobuf::OneofDescriptor_*>::operator++(&__end3);
  }
  local_188 = 0;
  while( true ) {
    iVar3 = Descriptor::field_count(this->descriptor_);
    pPVar1 = local_18;
    if (iVar3 <= local_188) break;
    io::Printer::Print<>(local_18,"\n");
    field = Descriptor::field(this->descriptor_,local_188);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (&this->field_generators_,field);
    (*pIVar8->_vptr_ImmutableFieldLiteGenerator[5])(pIVar8,local_18);
    local_188 = local_188 + 1;
  }
  psVar9 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x7872ae,psVar9);
  io::Printer::Outdent(local_18);
  io::Printer::Print<>(local_18,"}\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range3);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "extendible",
      descriptor_->extension_range_count() > 0 ? "Extendable" : "");
  printer->Indent();

  GenerateCommonBuilderMethods(printer);

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());

    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return instance.get$oneof_capitalized_name$Case();\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  copyOnWrite();\n"
                   "  instance.clear$oneof_capitalized_name$();\n"
                   "  return this;\n"
                   "}\n"
                   "\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}